

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O1

FloatMarkerData * __thiscall
C3DFile::getMarkerTrajectories
          (FloatMarkerData *__return_storage_ptr__,C3DFile *this,char *point_name_str)

{
  iterator iVar1;
  ulong uVar2;
  ostream *poVar3;
  string marker_name;
  key_type local_58;
  long *local_38 [2];
  long local_28 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,point_name_str,(allocator<char> *)local_38);
  std::__cxx11::string::find_last_not_of((char *)&local_58,0x10b75c,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)local_38,(ulong)&local_58);
  std::__cxx11::string::operator=((string *)&local_58,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
          ::find(&(this->label_point_map)._M_t,&local_58);
  if ((_Rb_tree_header *)iVar1._M_node !=
      &(this->label_point_map)._M_t._M_impl.super__Rb_tree_header) {
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
            ::find(&(this->label_point_map)._M_t,&local_58);
    uVar2 = (ulong)(ushort)(short)iVar1._M_node[2]._M_color;
    if (uVar2 < 0xff) {
      FloatMarkerData::FloatMarkerData
                (__return_storage_ptr__,
                 (this->float_point_data).
                 super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      return __return_storage_ptr__;
    }
    __assert_fail("index >= 0 && index < 255",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0x30,"FloatMarkerData C3DFile::getMarkerTrajectories(const char *)");
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error: could not find marker with name \'",0x28);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'!",2);
  std::endl<char,std::char_traits<char>>(poVar3);
  abort();
}

Assistant:

FloatMarkerData C3DFile::getMarkerTrajectories (const char* point_name_str) {
	std::string marker_name(point_name_str);
	
	marker_name = marker_name.substr(0, marker_name.find_last_not_of(" ") + 1);

	if (label_point_map.find(marker_name) == label_point_map.end()) {
		cerr << "Error: could not find marker with name '" << marker_name << "'!" << endl;
		abort();
	}

	Sint16 index = label_point_map.find(marker_name)->second;

	assert (index >= 0 && index < 255);

	return float_point_data[index];
}